

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void __thiscall
QMessageBoxPrivate::helperPrepareShow(QMessageBoxPrivate *this,QPlatformDialogHelper *param_1)

{
  QWidget *this_00;
  QMessageDialogOptions *pQVar1;
  long *plVar2;
  bool bVar3;
  ButtonRole BVar4;
  QPushButton *pQVar5;
  iterator iVar6;
  iterator iVar7;
  int button;
  StandardButton which;
  long in_FS_OFFSET;
  QFlagsStorage<QMessageBox::StandardButton> local_78;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  pQVar1 = (this->options).value.ptr;
  QWidget::windowTitle((QString *)&local_50,this_00);
  QMessageDialogOptions::setWindowTitle((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar1 = (this->options).value.ptr;
  QMessageBox::text((QString *)&local_50,(QMessageBox *)this_00);
  QMessageDialogOptions::setText((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar1 = (this->options).value.ptr;
  QMessageBox::informativeText((QString *)&local_50,(QMessageBox *)this_00);
  QMessageDialogOptions::setInformativeText((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar1 = (this->options).value.ptr;
  QMessageBox::detailedText((QString *)&local_50,(QMessageBox *)this_00);
  QMessageDialogOptions::setDetailedText((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QMessageDialogOptions::setStandardIcon((StandardIcon)(this->options).value.ptr);
  pQVar1 = (this->options).value.ptr;
  QMessageBox::iconPixmap((QMessageBox *)&local_50);
  QMessageDialogOptions::setIconPixmap((QPixmap *)pQVar1);
  QPixmap::~QPixmap((QPixmap *)&local_50);
  QMessageDialogOptions::clearCustomButtons();
  local_78.i = (Int)QMessageBox::standardButtons((QMessageBox *)this_00);
  for (which = FirstButton; (int)which < 0x8000001; which = which * 2) {
    pQVar5 = QDialogButtonBox::button((QDialogButtonBox *)this->buttonBox,which);
    plVar2 = QGuiApplicationPrivate::platform_theme;
    if (pQVar5 != (QPushButton *)0x0) {
      if (QGuiApplicationPrivate::platform_theme != (long *)0x0) {
        QAbstractButton::text((QString *)&local_50,&pQVar5->super_QAbstractButton);
        (**(code **)(*plVar2 + 0x88))(&local_68,plVar2,which);
        bVar3 = ::operator!=((QString *)&local_50,(QString *)&local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        if (bVar3) {
          BVar4 = QDialogButtonBox::buttonRole
                            ((QDialogButtonBox *)this->buttonBox,&pQVar5->super_QAbstractButton);
          pQVar1 = (this->options).value.ptr;
          QAbstractButton::text((QString *)&local_50,&pQVar5->super_QAbstractButton);
          QMessageDialogOptions::addButton
                    ((QString *)pQVar1,(ButtonRole)&local_50,(void *)(ulong)(uint)BVar4,(int)pQVar5)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
          local_78.i = local_78.i & ~which;
        }
      }
      if (pQVar5 == this->defaultButton) {
        QMessageDialogOptions::setDefaultButton((int)(this->options).value.ptr);
      }
      else if (pQVar5 == (QPushButton *)this->detectedEscapeButton) {
        QMessageDialogOptions::setEscapeButton((int)(this->options).value.ptr);
      }
    }
  }
  QMessageDialogOptions::setStandardButtons((this->options).value.ptr,local_78.i);
  iVar6 = QList<QAbstractButton_*>::begin(&this->customButtonList);
  iVar7 = QList<QAbstractButton_*>::end(&this->customButtonList);
  for (; iVar6.i != iVar7.i; iVar6.i = iVar6.i + 1) {
    pQVar5 = (QPushButton *)*iVar6.i;
    if (pQVar5 != &this->detailsButton->super_QPushButton) {
      BVar4 = QDialogButtonBox::buttonRole
                        ((QDialogButtonBox *)this->buttonBox,(QAbstractButton *)pQVar5);
      pQVar1 = (this->options).value.ptr;
      QAbstractButton::text((QString *)&local_50,(QAbstractButton *)pQVar5);
      QMessageDialogOptions::addButton
                ((QString *)pQVar1,(ButtonRole)&local_50,(void *)(ulong)(uint)BVar4,(int)pQVar5);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      if (pQVar5 == this->defaultButton) {
        QMessageDialogOptions::setDefaultButton((int)(this->options).value.ptr);
      }
      else if (pQVar5 == (QPushButton *)this->detectedEscapeButton) {
        QMessageDialogOptions::setEscapeButton((int)(this->options).value.ptr);
      }
    }
  }
  if (this->checkbox != (QCheckBox *)0x0) {
    pQVar1 = (this->options).value.ptr;
    QAbstractButton::text((QString *)&local_50,&this->checkbox->super_QAbstractButton);
    QCheckBox::checkState(this->checkbox);
    QMessageDialogOptions::setCheckBox((QString *)pQVar1,(CheckState)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBoxPrivate::helperPrepareShow(QPlatformDialogHelper *)
{
    Q_Q(QMessageBox);
    options->setWindowTitle(q->windowTitle());
    options->setText(q->text());
    options->setInformativeText(q->informativeText());
#if QT_CONFIG(textedit)
    options->setDetailedText(q->detailedText());
#endif
    options->setStandardIcon(helperIcon(q->icon()));
    options->setIconPixmap(q->iconPixmap());

    // Clear up front, since we might have prepared earlier
    options->clearCustomButtons();

    // Add standard buttons and resolve default/escape button
    auto standardButtons = helperStandardButtons(q);
    for (int button = QDialogButtonBox::StandardButton::FirstButton;
             button <= QDialogButtonBox::StandardButton::LastButton; button <<= 1) {
        auto *standardButton = buttonBox->button(QDialogButtonBox::StandardButton(button));
        if (!standardButton)
            continue;

        if (auto *platformTheme = QGuiApplicationPrivate::platformTheme()) {
            if (standardButton->text() != platformTheme->standardButtonText(button)) {
                // The standard button has been customized, so add it as
                // a custom button instead.
                const auto buttonRole = buttonBox->buttonRole(standardButton);
                options->addButton(standardButton->text(),
                    static_cast<QPlatformDialogHelper::ButtonRole>(buttonRole),
                    standardButton, button);
                standardButtons &= ~QPlatformDialogHelper::StandardButton(button);
            }
        }

        if (standardButton == defaultButton)
            options->setDefaultButton(button);
        else if (standardButton == detectedEscapeButton)
            options->setEscapeButton(button);
    }
    options->setStandardButtons(standardButtons);

    // Add custom buttons and resolve default/escape button
    for (auto *customButton : customButtonList) {
        // Unless it's the details button, since we don't do any
        // plumbing for the button's action in that case.
        if (customButton == detailsButton)
            continue;

        const auto buttonRole = buttonBox->buttonRole(customButton);
        const int buttonId = options->addButton(customButton->text(),
            static_cast<QPlatformDialogHelper::ButtonRole>(buttonRole),
            customButton);

        if (customButton == defaultButton)
            options->setDefaultButton(buttonId);
        else if (customButton == detectedEscapeButton)
            options->setEscapeButton(buttonId);
    }

    if (checkbox)
        options->setCheckBox(checkbox->text(), checkbox->checkState());
}